

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureCases.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Performance::Texture2DRenderCase::init(Texture2DRenderCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *pppTVar1;
  TestLog *pTVar2;
  int iVar3;
  undefined1 auVar4 [8];
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Mat3 *pMVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  Texture2D *pTVar11;
  int row;
  int col_3;
  long lVar12;
  long lVar13;
  Mat3 *pMVar14;
  long lVar15;
  uint width;
  uint height;
  Mat3 *pMVar16;
  iterator __position;
  long lVar17;
  long lVar18;
  ulong uVar19;
  float v;
  float fVar20;
  float v_1;
  float v_2;
  float v_3;
  Texture2D *texture;
  Vec2 p11;
  Vec2 p01;
  Vec2 p10;
  Vec2 p00;
  ostringstream fragSrc;
  uint local_244;
  Texture2D *local_238;
  undefined1 local_230 [16];
  long local_220 [2];
  uint local_20c;
  Enum<int,_2UL> local_208;
  undefined1 local_1f8 [8];
  undefined1 *puStack_1f0;
  Vec4 local_1e8;
  Vector<float,_2> local_1d8;
  Vector<float,_2> local_1d0;
  Vector<float,_2> local_1c8;
  Vector<float,_2> local_1c0;
  vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *local_1b8;
  undefined1 local_1b0 [8];
  undefined4 local_1a8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  pTVar2 = ((this->super_ShaderPerformanceCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[4])();
  width = *(uint *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[4])();
  height = *(uint *)(CONCAT44(extraout_var_00,iVar5) + 4);
  if (this->m_powerOfTwo == true) {
    iVar5 = 0x1f;
    if (width != 0) {
      for (; width >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    iVar3 = 0x1f;
    if (height != 0) {
      for (; height >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    width = width & -(0x80000000U >> (~(byte)iVar5 & 0x1f));
    height = height & -(0x80000000U >> (~(byte)iVar3 & 0x1f));
  }
  local_20c = this->m_minFilter & 0xfffffffc;
  pMVar7 = &this->m_coordTransform;
  lVar12 = 0;
  local_230._0_8_ = (GetNameFunc)0x0;
  local_230._8_4_ = 1.0;
  local_1b0 = (undefined1  [8])0x0;
  local_1a8[0] = 0;
  pMVar14 = pMVar7;
  do {
    fVar20 = 0.0;
    lVar18 = 0;
    pMVar16 = pMVar14;
    do {
      fVar20 = fVar20 + (pMVar16->m_data).m_data[0].m_data[0] * *(float *)(local_230 + lVar18 * 4);
      lVar18 = lVar18 + 1;
      pMVar16 = (Mat3 *)((pMVar16->m_data).m_data + 1);
    } while (lVar18 != 3);
    *(float *)(local_1b0 + lVar12 * 4) = fVar20;
    auVar4 = local_1b0;
    lVar12 = lVar12 + 1;
    pMVar14 = (Mat3 *)((pMVar14->m_data).m_data[0].m_data + 1);
  } while (lVar12 != 3);
  local_1c0.m_data[0] = (float)local_1b0._0_4_;
  local_1c0.m_data[1] = (float)local_1b0._4_4_;
  local_230._0_8_ = (GetNameFunc)0x3f800000;
  local_230._8_4_ = 1.0;
  local_1b0 = (undefined1  [8])0x0;
  local_1a8[0] = 0;
  lVar12 = 0;
  pMVar14 = pMVar7;
  do {
    fVar20 = 0.0;
    lVar18 = 0;
    pMVar16 = pMVar14;
    do {
      fVar20 = fVar20 + (pMVar16->m_data).m_data[0].m_data[0] * *(float *)(local_230 + lVar18 * 4);
      lVar18 = lVar18 + 1;
      pMVar16 = (Mat3 *)((pMVar16->m_data).m_data + 1);
    } while (lVar18 != 3);
    *(float *)(local_1b0 + lVar12 * 4) = fVar20;
    local_208.m_getName = (GetNameFunc)local_1b0;
    lVar12 = lVar12 + 1;
    pMVar14 = (Mat3 *)((pMVar14->m_data).m_data[0].m_data + 1);
  } while (lVar12 != 3);
  local_1c8.m_data[0] = (float)local_1b0._0_4_;
  local_1c8.m_data[1] = (float)local_1b0._4_4_;
  local_230._0_8_ = (GetNameFunc)0x3f80000000000000;
  local_230._8_4_ = 1.0;
  local_1b0 = (undefined1  [8])0x0;
  local_1a8[0] = 0;
  lVar12 = 0;
  pMVar14 = pMVar7;
  do {
    fVar20 = 0.0;
    lVar18 = 0;
    pMVar16 = pMVar14;
    do {
      fVar20 = fVar20 + (pMVar16->m_data).m_data[0].m_data[0] * *(float *)(local_230 + lVar18 * 4);
      lVar18 = lVar18 + 1;
      pMVar16 = (Mat3 *)((pMVar16->m_data).m_data + 1);
    } while (lVar18 != 3);
    *(float *)(local_1b0 + lVar12 * 4) = fVar20;
    lVar12 = lVar12 + 1;
    pMVar14 = (Mat3 *)((pMVar14->m_data).m_data[0].m_data + 1);
  } while (lVar12 != 3);
  local_1e8.m_data[0] = (float)local_1b0._0_4_;
  local_1e8.m_data[1] = (float)local_1b0._4_4_;
  local_1d0.m_data[0] = (float)local_1b0._0_4_;
  local_1d0.m_data[1] = (float)local_1b0._4_4_;
  local_230._0_8_ = &DAT_3f8000003f800000;
  local_230._8_4_ = 1.0;
  local_1b0 = (undefined1  [8])0x0;
  local_1a8[0] = 0;
  lVar12 = 0;
  do {
    fVar20 = 0.0;
    lVar18 = 0;
    pMVar14 = pMVar7;
    do {
      fVar20 = fVar20 + (pMVar14->m_data).m_data[0].m_data[0] * *(float *)(local_230 + lVar18 * 4);
      lVar18 = lVar18 + 1;
      pMVar14 = (Mat3 *)((pMVar14->m_data).m_data + 1);
    } while (lVar18 != 3);
    *(float *)(local_1b0 + lVar12 * 4) = fVar20;
    lVar12 = lVar12 + 1;
    pMVar7 = (Mat3 *)((pMVar7->m_data).m_data[0].m_data + 1);
  } while (lVar12 != 3);
  local_1d8.m_data[0] = (float)local_1b0._0_4_;
  local_1d8.m_data[1] = (float)local_1b0._4_4_;
  local_230._0_8_ = auVar4;
  local_230._8_8_ = 0;
  local_208.m_value = 0;
  local_208._12_4_ = 0;
  local_1e8.m_data[2] = 0.0;
  local_1e8.m_data[3] = 0.0;
  local_1f8 = local_1b0;
  puStack_1f0 = (undefined1 *)0x0;
  deqp::gls::AttribSpec::AttribSpec
            ((AttribSpec *)local_1b0,"a_coords",(Vec4 *)local_230,(Vec4 *)&local_208,&local_1e8,
             (Vec4 *)local_1f8);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>
            (&(this->super_ShaderPerformanceCase).m_attributes,(AttribSpec *)local_1b0);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  local_1b0 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Size: ",6);
  std::ostream::operator<<((ostringstream *)local_1a8,width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"x",1);
  std::ostream::operator<<((ostringstream *)local_1a8,height);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Format: ",8);
  pcVar8 = glu::getTextureFormatName(this->m_format);
  iVar5 = (int)(ostringstream *)local_1a8;
  if (pcVar8 == (char *)0x0) {
    std::ios::clear(iVar5 + (int)*(undefined8 *)(CONCAT44(local_1a8[1],local_1a8[0]) + -0x18));
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  pcVar8 = glu::getTypeName(this->m_dataType);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear(iVar5 + (int)*(undefined8 *)(CONCAT44(local_1a8[1],local_1a8[0]) + -0x18));
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar9);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Coords: ",8);
  tcu::operator<<((ostream *)local_1a8,&local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
  tcu::operator<<((ostream *)local_1a8,&local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
  tcu::operator<<((ostream *)local_1a8,&local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
  tcu::operator<<((ostream *)local_1a8,&local_1d8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Wrap: ",6);
  local_230._0_8_ = glu::getTextureWrapModeName;
  local_230._8_4_ = this->m_wrapS;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_230,(ostream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," / ",3);
  local_208.m_getName = glu::getTextureWrapModeName;
  local_208.m_value = this->m_wrapT;
  tcu::Format::Enum<int,_2UL>::toStream(&local_208,(ostream *)local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Filter: ",8);
  local_230._0_8_ = glu::getTextureFilterName;
  local_230._8_4_ = this->m_minFilter;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_230,(ostream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," / ",3);
  local_208.m_getName = glu::getTextureFilterName;
  local_208.m_value = this->m_magFilter;
  tcu::Format::Enum<int,_2UL>::toStream(&local_208,(ostream *)local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Mipmaps: ",9);
  pcVar8 = "false";
  if (local_20c == 0x2700) {
    pcVar8 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,pcVar8,(ulong)(local_20c == 0x2700) ^ 5);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Using additive blending.",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  deqp::gls::ShaderPerformanceCase::setViewportSize(&this->super_ShaderPerformanceCase,width,height)
  ;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ShaderPerformanceCase).m_vertShaderSource,0,
             (char *)(this->super_ShaderPerformanceCase).m_vertShaderSource._M_string_length,
             0x1c25973);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b0,"varying mediump vec2 v_coords;\n",0x1f);
  if (0 < this->m_numTextures) {
    iVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"uniform sampler2D u_sampler",0x1b);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      iVar5 = iVar5 + 1;
    } while (iVar5 < this->m_numTextures);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"{\n",2);
  if (0 < this->m_numTextures) {
    iVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"\t",1);
      pcVar8 = "r += ";
      if (iVar5 == 0) {
        pcVar8 = "lowp vec4 r = ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,pcVar8,(ulong)(iVar5 == 0) * 9 + 5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"texture2D(u_sampler",0x13);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", v_coords);\n",0xd);
      iVar5 = iVar5 + 1;
    } while (iVar5 < this->m_numTextures);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b0,"\tgl_FragColor = r;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderPerformanceCase).m_fragShaderSource,(string *)local_230);
  if ((long *)local_230._0_8_ != local_220) {
    operator_delete((void *)local_230._0_8_,local_220[0] + 1);
  }
  pTVar11 = (Texture2D *)&this->m_textures;
  __position._M_current = (Texture2D **)(long)this->m_numTextures;
  local_1b8 = (vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)pTVar11;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve
            ((vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *)pTVar11,
             (size_type)__position._M_current);
  if (0 < this->m_numTextures) {
    local_244 = 0;
    do {
      if (init()::swizzles == '\0') {
        init((EVP_PKEY_CTX *)pTVar11);
      }
      pTVar11 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (pTVar11,(this->super_ShaderPerformanceCase).m_renderCtx,this->m_format,
                 this->m_dataType,width,height);
      __position._M_current =
           (this->m_textures).
           super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_238 = pTVar11;
      if (__position._M_current ==
          (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::
        _M_realloc_insert<glu::Texture2D*const&>(local_1b8,__position,&local_238);
      }
      else {
        *__position._M_current = pTVar11;
        pppTVar1 = &(this->m_textures).
                    super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      uVar6 = 1;
      if (local_20c == 0x2700) {
        uVar6 = (int)((ulong)((long)(local_238->m_refTexture).super_TextureLevelPyramid.m_access.
                                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_238->m_refTexture).super_TextureLevelPyramid.m_access.
                                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
      }
      if (0 < (int)uVar6) {
        uVar19 = (ulong)((local_244 & 7) << 4);
        lVar12 = 0;
        iVar5 = 0;
        do {
          tcu::Texture2D::allocLevel(&local_238->m_refTexture,iVar5);
          local_208.m_getName = (GetNameFunc)0x0;
          local_208.m_value = 0;
          local_208._12_4_ = 0;
          lVar18 = (long)*(int *)((long)init::swizzles[0].m_data + uVar19);
          lVar13 = (long)*(int *)((long)init::swizzles[0].m_data + uVar19 + 4);
          lVar15 = (long)*(int *)((long)init::swizzles[0].m_data + uVar19 + 8);
          lVar17 = (long)*(int *)((long)init::swizzles[0].m_data + uVar19 + 0xc);
          local_230._4_4_ = *(undefined4 *)((long)&local_208.m_getName + lVar13 * 4);
          local_230._0_4_ = *(undefined4 *)((long)&local_208.m_getName + lVar18 * 4);
          local_230._12_4_ = *(float *)((long)&local_208.m_getName + lVar17 * 4);
          local_230._8_4_ = *(float *)((long)&local_208.m_getName + lVar15 * 4);
          local_1f8 = (undefined1  [8])&DAT_3f8000003f800000;
          puStack_1f0 = &DAT_3f8000003f800000;
          local_1e8.m_data[0] = *(float *)(local_1f8 + lVar18 * 4);
          local_1e8.m_data[1] = *(float *)(local_1f8 + lVar13 * 4);
          local_1e8.m_data[3] = *(float *)(local_1f8 + lVar17 * 4);
          local_1e8.m_data[2] = *(float *)(local_1f8 + lVar15 * 4);
          __position._M_current = (Texture2D **)local_230;
          tcu::fillWithComponentGradients
                    ((PixelBufferAccess *)
                     ((long)(((local_238->m_refTexture).super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_ConstPixelBufferAccess).m_size.m_data + lVar12 + -8),
                     (Vec4 *)local_230,&local_1e8);
          iVar5 = iVar5 + 1;
          lVar12 = lVar12 + 0x28;
        } while ((ulong)uVar6 * 0x28 != lVar12);
      }
      pTVar11 = local_238;
      (*local_238->_vptr_Texture2D[2])();
      local_244 = local_244 + 1;
    } while ((int)local_244 < this->m_numTextures);
  }
  deqp::gls::ShaderPerformanceCase::init
            (&this->super_ShaderPerformanceCase,(EVP_PKEY_CTX *)__position._M_current);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  iVar5 = std::ios_base::~ios_base(local_140);
  return iVar5;
}

Assistant:

void Texture2DRenderCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	int width	= m_renderCtx.getRenderTarget().getWidth();
	int height	= m_renderCtx.getRenderTarget().getHeight();

	if (m_powerOfTwo)
	{
		width	= roundDownToPowerOfTwo(width);
		height	= roundDownToPowerOfTwo(height);
	}

	bool mipmaps = m_minFilter == GL_NEAREST_MIPMAP_NEAREST ||
				   m_minFilter == GL_NEAREST_MIPMAP_LINEAR	||
				   m_minFilter == GL_LINEAR_MIPMAP_NEAREST	||
				   m_minFilter == GL_LINEAR_MIPMAP_LINEAR;

	DE_ASSERT(m_powerOfTwo || (!mipmaps && m_wrapS == GL_CLAMP_TO_EDGE && m_wrapT == GL_CLAMP_TO_EDGE));

	Vec2 p00 = (m_coordTransform * Vec3(0.0f, 0.0f, 1.0f)).swizzle(0,1);
	Vec2 p10 = (m_coordTransform * Vec3(1.0f, 0.0f, 1.0f)).swizzle(0,1);
	Vec2 p01 = (m_coordTransform * Vec3(0.0f, 1.0f, 1.0f)).swizzle(0,1);
	Vec2 p11 = (m_coordTransform * Vec3(1.0f, 1.0f, 1.0f)).swizzle(0,1);

	m_attributes.push_back(AttribSpec("a_coords", Vec4(p00.x(), p00.y(), 0.0f, 0.0f),
												  Vec4(p10.x(), p10.y(), 0.0f, 0.0f),
												  Vec4(p01.x(), p01.y(), 0.0f, 0.0f),
												  Vec4(p11.x(), p11.y(), 0.0f, 0.0f)));

	log << TestLog::Message << "Size: " << width << "x" << height << TestLog::EndMessage;
	log << TestLog::Message << "Format: " <<glu::getTextureFormatName(m_format) << " " << glu::getTypeName(m_dataType) << TestLog::EndMessage;
	log << TestLog::Message << "Coords: " << p00 << ", " << p10 << ", " << p01 << ", " << p11 << TestLog::EndMessage;
	log << TestLog::Message << "Wrap: " << glu::getTextureWrapModeStr(m_wrapS) << " / " << glu::getTextureWrapModeStr(m_wrapT) << TestLog::EndMessage;
	log << TestLog::Message << "Filter: " << glu::getTextureFilterStr(m_minFilter) << " / " << glu::getTextureFilterStr(m_magFilter) << TestLog::EndMessage;
	log << TestLog::Message << "Mipmaps: " << (mipmaps ? "true" : "false") << TestLog::EndMessage;
	log << TestLog::Message << "Using additive blending." << TestLog::EndMessage;

	// Use same viewport size as texture size.
	setViewportSize(width, height);

	m_vertShaderSource =
		"attribute highp vec4 a_position;\n"
		"attribute mediump vec2 a_coords;\n"
		"varying mediump vec2 v_coords;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_coords = a_coords;\n"
		"}\n";

	std::ostringstream fragSrc;
	fragSrc << "varying mediump vec2 v_coords;\n";

	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		fragSrc << "uniform sampler2D u_sampler" << texNdx << ";\n";

	fragSrc << "void main (void)\n"
			<< "{\n";

	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		fragSrc << "\t" << (texNdx == 0 ? "lowp vec4 r = " : "r += ") << "texture2D(u_sampler" << texNdx << ", v_coords);\n";

	fragSrc << "	gl_FragColor = r;\n"
			<< "}\n";

	m_fragShaderSource = fragSrc.str();

	m_textures.reserve(m_numTextures);
	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
	{
		static const IVec4 swizzles[] = { IVec4(0,1,2,3), IVec4(1,2,3,0), IVec4(2,3,0,1), IVec4(3,0,1,2),
										  IVec4(3,2,1,0), IVec4(2,1,0,3), IVec4(1,0,3,2), IVec4(0,3,2,1) };
		const IVec4& sw = swizzles[texNdx % DE_LENGTH_OF_ARRAY(swizzles)];

		glu::Texture2D* texture = new glu::Texture2D(m_renderCtx, m_format, m_dataType, width, height);
		m_textures.push_back(texture);

		// Fill levels.
		int numLevels = mipmaps ? texture->getRefTexture().getNumLevels() : 1;
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			texture->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(texture->getRefTexture().getLevel(levelNdx),
											Vec4(0.0f, 0.0f, 0.0f, 0.0f).swizzle(sw[0], sw[1], sw[2], sw[3]),
											Vec4(1.0f, 1.0f, 1.0f, 1.0f).swizzle(sw[0], sw[1], sw[2], sw[3]));
		}

		texture->upload();
	}

	ShaderPerformanceCase::init();
}